

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O0

JDIMENSION jpeg_read_scanlines(j_decompress_ptr cinfo,JSAMPARRAY scanlines,JDIMENSION max_lines)

{
  JSAMPROW pJVar1;
  JDIMENSION local_28;
  JDIMENSION local_24;
  JDIMENSION row_ctr;
  JDIMENSION max_lines_local;
  JSAMPARRAY scanlines_local;
  j_decompress_ptr cinfo_local;
  
  local_24 = max_lines;
  _row_ctr = scanlines;
  scanlines_local = (JSAMPARRAY)cinfo;
  if (cinfo->global_state != 0xcd) {
    cinfo->err->msg_code = 0x15;
    (cinfo->err->msg_parm).i[0] = cinfo->global_state;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  if (*(uint *)(scanlines_local + 0x15) < *(uint *)((long)scanlines_local + 0x8c)) {
    if (scanlines_local[2] != (JSAMPROW)0x0) {
      *(ulong *)(scanlines_local[2] + 8) = (ulong)*(uint *)(scanlines_local + 0x15);
      *(ulong *)(scanlines_local[2] + 0x10) = (ulong)*(uint *)((long)scanlines_local + 0x8c);
      (**(code **)scanlines_local[2])(scanlines_local);
    }
    local_28 = 0;
    (**(code **)(scanlines_local[0x48] + 8))(scanlines_local,_row_ctr,&local_28,local_24);
    *(JDIMENSION *)(scanlines_local + 0x15) = local_28 + *(int *)(scanlines_local + 0x15);
    cinfo_local._4_4_ = local_28;
  }
  else {
    pJVar1 = *scanlines_local;
    pJVar1[0x28] = '~';
    pJVar1[0x29] = '\0';
    pJVar1[0x2a] = '\0';
    pJVar1[0x2b] = '\0';
    (**(code **)(*scanlines_local + 8))(scanlines_local,0xffffffff);
    cinfo_local._4_4_ = 0;
  }
  return cinfo_local._4_4_;
}

Assistant:

GLOBAL(JDIMENSION)
jpeg_read_scanlines (j_decompress_ptr cinfo, JSAMPARRAY scanlines,
		     JDIMENSION max_lines)
{
  JDIMENSION row_ctr;

  if (cinfo->global_state != DSTATE_SCANNING)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  if (cinfo->output_scanline >= cinfo->output_height) {
    WARNMS(cinfo, JWRN_TOO_MUCH_DATA);
    return 0;
  }

  /* Call progress monitor hook if present */
  if (cinfo->progress != NULL) {
    cinfo->progress->pass_counter = (long) cinfo->output_scanline;
    cinfo->progress->pass_limit = (long) cinfo->output_height;
    (*cinfo->progress->progress_monitor) ((j_common_ptr) cinfo);
  }

  /* Process some data */
  row_ctr = 0;
  (*cinfo->main->process_data) (cinfo, scanlines, &row_ctr, max_lines);
  cinfo->output_scanline += row_ctr;
  return row_ctr;
}